

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O0

void patternNode(FILE *out,xmlTextReaderPtr reader,char *pattern,xmlPatternPtr patternc,
                xmlStreamCtxtPtr patstream)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  int ret;
  int empty;
  int type;
  int match;
  xmlChar *path;
  xmlStreamCtxtPtr patstream_local;
  xmlPatternPtr patternc_local;
  char *pattern_local;
  xmlTextReaderPtr reader_local;
  FILE *out_local;
  
  _type = 0;
  empty = -1;
  iVar1 = xmlTextReaderNodeType(reader);
  iVar2 = xmlTextReaderIsEmptyElement(reader);
  if (iVar1 == 1) {
    uVar4 = xmlTextReaderCurrentNode(reader);
    empty = xmlPatternMatch(patternc,uVar4);
    if (empty != 0) {
      uVar4 = xmlTextReaderCurrentNode(reader);
      _type = xmlGetNodePath(uVar4);
      fprintf((FILE *)out,"Node %s matches pattern %s\n",_type,pattern);
    }
  }
  if (patstream != (xmlStreamCtxtPtr)0x0) {
    path = (xmlChar *)patstream;
    if (iVar1 == 1) {
      uVar4 = xmlTextReaderConstLocalName(reader);
      uVar5 = xmlTextReaderConstNamespaceUri(reader);
      iVar3 = xmlStreamPush(patstream,uVar4,uVar5);
      if (iVar3 < 0) {
        fprintf((FILE *)out,"xmlStreamPush() failure\n");
        xmlFreeStreamCtxt(patstream);
        path = (xmlChar *)0x0;
      }
      else if (iVar3 != empty) {
        if (_type == 0) {
          uVar4 = xmlTextReaderCurrentNode(reader);
          _type = xmlGetNodePath(uVar4);
        }
        fprintf((FILE *)out,"xmlPatternMatch and xmlStreamPush disagree\n");
        fprintf((FILE *)out,"  pattern %s node %s\n",pattern,_type);
      }
    }
    if (((iVar1 == 0xf) || ((iVar1 == 1 && (iVar2 != 0)))) &&
       (iVar1 = xmlStreamPop(path), iVar1 < 0)) {
      fprintf((FILE *)out,"xmlStreamPop() failure\n");
      xmlFreeStreamCtxt(path);
    }
  }
  if (_type != 0) {
    (*_xmlFree)(_type);
  }
  return;
}

Assistant:

static void patternNode(FILE *out, xmlTextReaderPtr reader,
                        const char *pattern, xmlPatternPtr patternc,
			xmlStreamCtxtPtr patstream) {
    xmlChar *path = NULL;
    int match = -1;
    int type, empty;

    type = xmlTextReaderNodeType(reader);
    empty = xmlTextReaderIsEmptyElement(reader);

    if (type == XML_READER_TYPE_ELEMENT) {
	/* do the check only on element start */
	match = xmlPatternMatch(patternc, xmlTextReaderCurrentNode(reader));

	if (match) {
	    path = xmlGetNodePath(xmlTextReaderCurrentNode(reader));
	    fprintf(out, "Node %s matches pattern %s\n", path, pattern);
	}
    }
    if (patstream != NULL) {
	int ret;

	if (type == XML_READER_TYPE_ELEMENT) {
	    ret = xmlStreamPush(patstream,
				xmlTextReaderConstLocalName(reader),
				xmlTextReaderConstNamespaceUri(reader));
	    if (ret < 0) {
		fprintf(out, "xmlStreamPush() failure\n");
		xmlFreeStreamCtxt(patstream);
		patstream = NULL;
	    } else if (ret != match) {
		if (path == NULL) {
		    path = xmlGetNodePath(
				   xmlTextReaderCurrentNode(reader));
		}
		fprintf(out,
			"xmlPatternMatch and xmlStreamPush disagree\n");
		fprintf(out,
			"  pattern %s node %s\n",
			pattern, path);
	    }


	}
	if ((type == XML_READER_TYPE_END_ELEMENT) ||
	    ((type == XML_READER_TYPE_ELEMENT) && (empty))) {
	    ret = xmlStreamPop(patstream);
	    if (ret < 0) {
		fprintf(out, "xmlStreamPop() failure\n");
		xmlFreeStreamCtxt(patstream);
		patstream = NULL;
	    }
	}
    }
    if (path != NULL)
	xmlFree(path);
}